

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.h
# Opt level: O0

bool __thiscall QMarginsF::isNull(QMarginsF *this)

{
  bool bVar1;
  double in_RDI;
  undefined1 local_9;
  
  bVar1 = qFuzzyIsNull(in_RDI);
  local_9 = false;
  if (bVar1) {
    bVar1 = qFuzzyIsNull(in_RDI);
    local_9 = false;
    if (bVar1) {
      bVar1 = qFuzzyIsNull(in_RDI);
      local_9 = false;
      if (bVar1) {
        local_9 = qFuzzyIsNull(in_RDI);
      }
    }
  }
  return local_9;
}

Assistant:

constexpr inline bool QMarginsF::isNull() const noexcept
{ return qFuzzyIsNull(m_left) && qFuzzyIsNull(m_top) && qFuzzyIsNull(m_right) && qFuzzyIsNull(m_bottom); }